

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

int cigar_iref2iseq_next(uint32_t **cigar,uint32_t *cigar_max,int *icig,int *iseq,int *iref)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint *puVar5;
  uint uVar6;
  
  puVar5 = *cigar;
LAB_00113e47:
  do {
    if (cigar_max <= puVar5) {
      *iseq = -1;
      iVar4 = -1;
      iVar3 = iVar4;
LAB_00113ee7:
      *iref = iVar4;
      return iVar3;
    }
    uVar1 = *puVar5;
    uVar2 = uVar1 & 0xf;
    uVar6 = uVar1 >> 4;
    if ((uVar1 & 7) == 0 || uVar2 == 7) {
      if (*icig < (int)(uVar6 - 1)) {
        *iseq = *iseq + 1;
        *icig = *icig + 1;
        iVar4 = *iref + 1;
        iVar3 = 0;
        goto LAB_00113ee7;
      }
      *icig = 0;
      puVar5 = puVar5 + 1;
      *cigar = puVar5;
      goto LAB_00113e47;
    }
    if ((uVar1 & 0xe) == 2) {
      puVar5 = puVar5 + 1;
      *cigar = puVar5;
      *iref = *iref + uVar6;
      *icig = 0;
    }
    else if ((uVar2 == 4) || (uVar2 == 1)) {
      puVar5 = puVar5 + 1;
      *cigar = puVar5;
      *iseq = *iseq + uVar6;
      *icig = 0;
    }
    else {
      if (1 < uVar2 - 5) {
        fprintf(_stderr,"todo: cigar %d\n",(ulong)uVar2);
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/sam.c"
                      ,0x605,
                      "int cigar_iref2iseq_next(uint32_t **, uint32_t *, int *, int *, int *)");
      }
      puVar5 = puVar5 + 1;
      *cigar = puVar5;
      *icig = 0;
    }
  } while( true );
}

Assistant:

static inline int cigar_iref2iseq_next(uint32_t **cigar, uint32_t *cigar_max, int *icig, int *iseq, int *iref)
{
    while ( *cigar < cigar_max )
    {
        int cig  = (**cigar) & BAM_CIGAR_MASK;
        int ncig = (**cigar) >> BAM_CIGAR_SHIFT;

        if ( cig==BAM_CMATCH || cig==BAM_CEQUAL || cig==BAM_CDIFF )
        {
            if ( *icig >= ncig - 1 ) { *icig = 0;  (*cigar)++; continue; }
            (*iseq)++; (*icig)++; (*iref)++;
            return BAM_CMATCH;
        }
        if ( cig==BAM_CDEL || cig==BAM_CREF_SKIP ) { (*cigar)++; (*iref) += ncig; *icig = 0; continue; }
        if ( cig==BAM_CINS ) { (*cigar)++; *iseq += ncig; *icig = 0; continue; }
        if ( cig==BAM_CSOFT_CLIP ) { (*cigar)++; *iseq += ncig; *icig = 0; continue; }
        if ( cig==BAM_CHARD_CLIP || cig==BAM_CPAD ) { (*cigar)++; *icig = 0; continue; }
        fprintf(stderr,"todo: cigar %d\n", cig);
        assert(0);
    }
    *iseq = -1;
    *iref = -1;
    return -1;
}